

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode cf_setup_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  Curl_cfilter *pCVar4;
  curl_trc_feat *pcVar5;
  _Bool _Var6;
  CURLcode CVar7;
  long lVar8;
  uint *puVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  Curl_cfilter *pCVar11;
  connectdata *pcVar12;
  Curl_cfilter *local_50;
  uint local_44;
  _Bool *local_40;
  uint *local_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    uVar10 = CONCAT71(in_register_00000011,blocking) & 0xffffffff;
    local_38 = (uint *)cf->ctx;
    pCVar11 = cf->next;
    puVar9 = local_38;
LAB_0011b187:
    if ((pCVar11 != (Curl_cfilter *)0x0) && ((pCVar11->field_0x24 & 1) == 0)) {
      CVar7 = Curl_conn_cf_connect(pCVar11,data,SUB81(uVar10,0),done);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      if (*done != true) {
        return CURLE_OK;
      }
    }
    uVar1 = *puVar9;
    if (uVar1 == 1) {
LAB_0011b29b:
      if (((ulong)cf->conn->bits & 2) != 0) {
        CVar7 = Curl_cf_socks_proxy_insert_after(cf,data);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        *puVar9 = 2;
        pCVar4 = cf->next;
        pCVar11 = (Curl_cfilter *)0x0;
        if ((pCVar4 == (Curl_cfilter *)0x0) || (pCVar11 = pCVar4, (pCVar4->field_0x24 & 1) == 0))
        goto LAB_0011b187;
      }
LAB_0011b2ec:
      pcVar12 = cf->conn;
      if (((ulong)pcVar12->bits & 1) != 0) {
        if (((((pcVar12->http_proxy).proxytype & 0xfe) == 2) &&
            (_Var6 = Curl_conn_is_ssl(pcVar12,cf->sockindex), !_Var6)) &&
           (CVar7 = Curl_cf_ssl_proxy_insert_after(cf,data), CVar7 != CURLE_OK)) {
          return CVar7;
        }
        if ((((ulong)cf->conn->bits & 8) != 0) &&
           (CVar7 = Curl_cf_http_proxy_insert_after(cf,data), CVar7 != CURLE_OK)) {
          return CVar7;
        }
        *puVar9 = 3;
        pCVar4 = cf->next;
        pCVar11 = (Curl_cfilter *)0x0;
        if ((pCVar4 == (Curl_cfilter *)0x0) || (pCVar11 = pCVar4, (pCVar4->field_0x24 & 1) == 0))
        goto LAB_0011b187;
      }
LAB_0011b372:
      if (((data->set).field_0x8cf & 0x20) != 0) {
        _Var6 = Curl_conn_is_ssl(cf->conn,cf->sockindex);
        if (_Var6) {
          Curl_failf(data,"haproxy protocol not support with SSL encryption in place (QUIC?)");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        CVar7 = Curl_cf_haproxy_insert_after(cf,data);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
      }
      *puVar9 = 4;
      pCVar4 = cf->next;
      pCVar11 = (Curl_cfilter *)0x0;
      if ((pCVar4 == (Curl_cfilter *)0x0) || (pCVar11 = pCVar4, (pCVar4->field_0x24 & 1) == 0))
      goto LAB_0011b187;
    }
    else {
      if (uVar1 == 0) {
        uVar2 = *(undefined8 *)(puVar9 + 2);
        uVar1 = puVar9[5];
        lVar3 = 0;
        do {
          lVar8 = lVar3;
          if (lVar8 + 0x10 == 0x40) goto LAB_0011b452;
          lVar3 = lVar8 + 0x10;
        } while (*(uint *)((long)&transport_providers[0].transport + lVar8) != uVar1);
        lVar3 = *(long *)((long)&transport_providers[0].cf_create + lVar8);
        if (lVar3 == 0) {
LAB_0011b452:
          if (data == (Curl_easy *)0x0) {
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          pcVar5 = (data->state).feat;
          if (pcVar5 == (curl_trc_feat *)0x0) {
            if (cf == (Curl_cfilter *)0x0) {
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
          }
          else {
            if (cf == (Curl_cfilter *)0x0) {
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
            if (pcVar5->log_level < 1) {
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
          }
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"unsupported transport type %d",(ulong)uVar1);
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        local_44 = (uint)uVar10;
        local_50 = (Curl_cfilter *)0x0;
        local_40 = done;
        puVar9 = (uint *)(*Curl_ccalloc)(1,0x48);
        if (puVar9 == (uint *)0x0) {
          CVar7 = CURLE_OUT_OF_MEMORY;
          pCVar11 = (Curl_cfilter *)0x0;
LAB_0011b4cf:
          (*Curl_cfree)(pCVar11);
          local_50 = (Curl_cfilter *)0x0;
          (*Curl_cfree)(puVar9);
          return CVar7;
        }
        *puVar9 = uVar1;
        *(long *)(puVar9 + 2) = lVar3;
        *(undefined8 *)(puVar9 + 4) = uVar2;
        CVar7 = Curl_cf_create(&local_50,&Curl_cft_happy_eyeballs,puVar9);
        pCVar11 = local_50;
        if (CVar7 != CURLE_OK) goto LAB_0011b4cf;
        Curl_conn_cf_insert_after(cf,local_50);
        *local_38 = 1;
        pCVar4 = cf->next;
        uVar10 = (ulong)local_44;
        pCVar11 = (Curl_cfilter *)0x0;
        done = local_40;
        puVar9 = local_38;
        if ((pCVar4 != (Curl_cfilter *)0x0) && (pCVar11 = pCVar4, (pCVar4->field_0x24 & 1) != 0))
        goto LAB_0011b29b;
        goto LAB_0011b187;
      }
      if (uVar1 < 3) goto LAB_0011b2ec;
      if (uVar1 == 3) goto LAB_0011b372;
      if (4 < uVar1) goto LAB_0011b439;
    }
    if (puVar9[4] != 0) {
      if (puVar9[4] == 1) {
        pcVar12 = cf->conn;
      }
      else {
        pcVar12 = cf->conn;
        if ((pcVar12->handler->flags & 1) == 0) goto LAB_0011b413;
      }
      _Var6 = Curl_conn_is_ssl(pcVar12,cf->sockindex);
      if ((!_Var6) && (CVar7 = Curl_cf_ssl_insert_after(cf,data), CVar7 != CURLE_OK)) {
        return CVar7;
      }
    }
LAB_0011b413:
    *puVar9 = 5;
    pCVar4 = cf->next;
    pCVar11 = (Curl_cfilter *)0x0;
    if ((pCVar4 == (Curl_cfilter *)0x0) || (pCVar11 = pCVar4, (pCVar4->field_0x24 & 1) == 0))
    goto LAB_0011b187;
LAB_0011b439:
    *puVar9 = 6;
    cf->field_0x24 = cf->field_0x24 | 1;
  }
  *done = true;
  return CURLE_OK;
}

Assistant:

static CURLcode cf_setup_connect(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 bool blocking, bool *done)
{
  struct cf_setup_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* connect current sub-chain */
connect_sub_chain:
  if(cf->next && !cf->next->connected) {
    result = Curl_conn_cf_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  if(ctx->state < CF_SETUP_CNNCT_EYEBALLS) {
    result = cf_he_insert_after(cf, data, ctx->remotehost, ctx->transport);
    if(result)
      return result;
    ctx->state = CF_SETUP_CNNCT_EYEBALLS;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  /* sub-chain connected, do we need to add more? */
#ifndef CURL_DISABLE_PROXY
  if(ctx->state < CF_SETUP_CNNCT_SOCKS && cf->conn->bits.socksproxy) {
    result = Curl_cf_socks_proxy_insert_after(cf, data);
    if(result)
      return result;
    ctx->state = CF_SETUP_CNNCT_SOCKS;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  if(ctx->state < CF_SETUP_CNNCT_HTTP_PROXY && cf->conn->bits.httpproxy) {
#ifdef USE_SSL
    if(IS_HTTPS_PROXY(cf->conn->http_proxy.proxytype)
       && !Curl_conn_is_ssl(cf->conn, cf->sockindex)) {
      result = Curl_cf_ssl_proxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* USE_SSL */

#if !defined(CURL_DISABLE_HTTP)
    if(cf->conn->bits.tunnel_proxy) {
      result = Curl_cf_http_proxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* !CURL_DISABLE_HTTP */
    ctx->state = CF_SETUP_CNNCT_HTTP_PROXY;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }
#endif /* !CURL_DISABLE_PROXY */

  if(ctx->state < CF_SETUP_CNNCT_HAPROXY) {
#if !defined(CURL_DISABLE_PROXY)
    if(data->set.haproxyprotocol) {
      if(Curl_conn_is_ssl(cf->conn, cf->sockindex)) {
        failf(data, "haproxy protocol not support with SSL "
              "encryption in place (QUIC?)");
        return CURLE_UNSUPPORTED_PROTOCOL;
      }
      result = Curl_cf_haproxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* !CURL_DISABLE_PROXY */
    ctx->state = CF_SETUP_CNNCT_HAPROXY;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  if(ctx->state < CF_SETUP_CNNCT_SSL) {
#ifdef USE_SSL
    if((ctx->ssl_mode == CURL_CF_SSL_ENABLE
        || (ctx->ssl_mode != CURL_CF_SSL_DISABLE
           && cf->conn->handler->flags & PROTOPT_SSL)) /* we want SSL */
       && !Curl_conn_is_ssl(cf->conn, cf->sockindex)) { /* it is missing */
      result = Curl_cf_ssl_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* USE_SSL */
    ctx->state = CF_SETUP_CNNCT_SSL;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  ctx->state = CF_SETUP_DONE;
  cf->connected = TRUE;
  *done = TRUE;
  return CURLE_OK;
}